

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  bool bVar2;
  
  bVar2 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                    (&this->message_type_);
  if ((((!bVar2) ||
       (bVar2 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                          (&this->enum_type_), !bVar2)) ||
      (bVar2 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>>
                         (&this->service_), !bVar2)) ||
     (bVar2 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                        (&this->extension_), !bVar2)) {
    return false;
  }
  if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
    pFVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pFVar1->_extensions_);
    if (!bVar2) {
      return false;
    }
    bVar2 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pFVar1->uninterpreted_option_);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->message_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->service())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}